

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O0

void Abc_NodeShowBdd(Abc_Obj_t *pNode)

{
  int iVar1;
  char *pName;
  FILE *__stream;
  char *local_f0;
  char *pNameOut;
  char FileNameDot [200];
  Vec_Ptr_t *vNamesIn;
  FILE *pFile;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NtkIsBddLogic(pNode->pNtk);
  if (iVar1 != 0) {
    pName = Abc_ObjName(pNode);
    Abc_ShowGetFileName(pName,(char *)&pNameOut);
    __stream = fopen((char *)&pNameOut,"w");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",&pNameOut);
    }
    else {
      FileNameDot._192_8_ = Abc_NodeGetFaninNames(pNode);
      local_f0 = Abc_ObjName(pNode);
      Cudd_DumpDot((DdManager *)pNode->pNtk->pManFunc,1,(DdNode **)&(pNode->field_5).pData,
                   *(char ***)(FileNameDot._192_8_ + 8),&local_f0,(FILE *)__stream);
      Abc_NodeFreeNames((Vec_Ptr_t *)FileNameDot._192_8_);
      Abc_NtkCleanCopy(pNode->pNtk);
      fclose(__stream);
      Abc_ShowFile((char *)&pNameOut);
    }
    return;
  }
  __assert_fail("Abc_NtkIsBddLogic(pNode->pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcShow.c"
                ,0x5f,"void Abc_NodeShowBdd(Abc_Obj_t *)");
}

Assistant:

void Abc_NodeShowBdd( Abc_Obj_t * pNode )
{
    FILE * pFile;
    Vec_Ptr_t * vNamesIn;
    char FileNameDot[200];
    char * pNameOut;

    assert( Abc_NtkIsBddLogic(pNode->pNtk) );
    // create the file name
    Abc_ShowGetFileName( Abc_ObjName(pNode), FileNameDot );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }

    // set the node names 
    vNamesIn = Abc_NodeGetFaninNames( pNode );
    pNameOut = Abc_ObjName(pNode);
    Cudd_DumpDot( (DdManager *)pNode->pNtk->pManFunc, 1, (DdNode **)&pNode->pData, (char **)vNamesIn->pArray, &pNameOut, pFile );
    Abc_NodeFreeNames( vNamesIn );
    Abc_NtkCleanCopy( pNode->pNtk );
    fclose( pFile );

    // visualize the file 
    Abc_ShowFile( FileNameDot );
}